

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_rumors(char *in_tru,char *in_false,char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  char *in_RAX;
  long lVar6;
  char *pcVar7;
  byte *pbVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  uint uVar12;
  char *unaff_RBP;
  byte bVar13;
  byte bVar14;
  char *unaff_R12;
  undefined8 unaff_R13;
  char (*__s2) [3];
  char acStack_270 [256];
  long alStack_170 [33];
  char *pcStack_68;
  char *pcStack_60;
  undefined8 uStack_58;
  char *pcStack_50;
  char *pcStack_48;
  code *pcStack_40;
  char *local_38;
  
  pcStack_40 = (code *)0x10ad9e;
  local_38 = in_RAX;
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_40 = (code *)0x10afca;
    do_rumors_cold_3();
LAB_0010afca:
    pcStack_40 = (code *)0x10afd6;
    do_rumors_cold_2();
  }
  else {
    pcStack_40 = (code *)0x10adc1;
    local_38 = outfile;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_40 = (code *)0x10add0;
    ifp = (FILE *)fopen(in_tru,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010afca;
    unaff_R13 = 0;
    pcStack_40 = (code *)0x10adf2;
    fseek((FILE *)ifp,0,2);
    pcStack_40 = (code *)0x10adfe;
    lVar6 = ftell((FILE *)ifp);
    pcStack_40 = (code *)0x10ae16;
    fprintf((FILE *)ofp,"%06lx\n",lVar6);
    pcStack_40 = (code *)0x10ae26;
    fseek((FILE *)ifp,0,0);
    pcStack_40 = (code *)0x10ae3e;
    pcVar7 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar7 != (char *)0x0) {
      in_tru = &xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = in_line + 1;
      outfile = (char *)0x1;
      do {
        pbVar8 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar7 = in_line;
          pbVar8 = &xcrypt_buf;
          bVar13 = in_line[0];
          do {
            pcVar7 = (char *)((byte *)pcVar7 + 1);
            bVar14 = (byte)iVar4;
            if ((bVar13 & 0x60) == 0) {
              bVar14 = 0;
            }
            *pbVar8 = bVar14 ^ bVar13;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar8 = pbVar8 + 1;
            bVar13 = *pcVar7;
          } while (bVar13 != 0);
        }
        *pbVar8 = 0;
        pcStack_40 = (code *)0x10aeb3;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_40 = (code *)0x10aec7;
        pcVar7 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar7 != (char *)0x0);
    }
    pcStack_40 = (code *)0x10aed8;
    fclose((FILE *)ifp);
    pcStack_40 = (code *)0x10aee7;
    ifp = (FILE *)fopen(in_false,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_40 = (code *)0x10af0b;
      pcVar7 = fgets(in_line,0x100,(FILE *)ifp);
      while (pcVar7 != (char *)0x0) {
        pbVar8 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar7 = in_line;
          pbVar8 = &xcrypt_buf;
          bVar13 = in_line[0];
          do {
            pcVar7 = (char *)((byte *)pcVar7 + 1);
            bVar14 = (byte)iVar4;
            if ((bVar13 & 0x60) == 0) {
              bVar14 = 0;
            }
            *pbVar8 = bVar14 ^ bVar13;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar8 = pbVar8 + 1;
            bVar13 = *pcVar7;
          } while (bVar13 != 0);
        }
        *pbVar8 = 0;
        pcStack_40 = (code *)0x10af83;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_40 = (code *)0x10af97;
        pcVar7 = fgets(in_line,0x100,(FILE *)ifp);
      }
      pcStack_40 = (code *)0x10afa8;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_40 = do_oracles;
  pcVar7 = local_38;
  pcVar9 = in_false;
  do_rumors_cold_1();
  pcStack_68 = outfile;
  pcStack_60 = unaff_R12;
  uStack_58 = unaff_R13;
  pcStack_50 = in_false;
  pcStack_48 = in_tru;
  pcStack_40 = (code *)unaff_RBP;
  sprintf(acStack_270,"%s.%s",pcVar7,"tmp");
  ifp = (FILE *)fopen(pcVar9,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b4f3:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar7,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_270,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        lVar6 = 0;
        do {
          pbVar8 = (byte *)special_oracle[lVar6];
          bVar13 = *pbVar8;
          pbVar11 = &xcrypt_buf;
          if (bVar13 != 0) {
            iVar4 = 1;
            pbVar11 = &xcrypt_buf;
            do {
              pbVar8 = pbVar8 + 1;
              bVar14 = (byte)iVar4;
              if ((bVar13 & 0x60) == 0) {
                bVar14 = 0;
              }
              *pbVar11 = bVar14 ^ bVar13;
              iVar4 = iVar4 * 2;
              if (0x1f < iVar4) {
                iVar4 = 1;
              }
              pbVar11 = pbVar11 + 1;
              bVar13 = *pbVar8;
            } while (bVar13 != 0);
          }
          *pbVar11 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        uVar12 = 1;
LAB_0010b1ac:
        bVar2 = true;
LAB_0010b1af:
        while (pcVar9 = fgets(in_line,0x100,(FILE *)ifp), pcVar9 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_170);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b1fb;
            pbVar8 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar4 = 1;
              pcVar9 = in_line;
              pbVar8 = &xcrypt_buf;
              bVar13 = in_line[0];
              do {
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar14 = (byte)iVar4;
                if ((bVar13 & 0x60) == 0) {
                  bVar14 = 0;
                }
                *pbVar8 = bVar14 ^ bVar13;
                iVar4 = iVar4 * 2;
                if (0x1f < iVar4) {
                  iVar4 = 1;
                }
                pbVar8 = pbVar8 + 1;
                bVar13 = *pcVar9;
              } while (bVar13 != 0);
            }
            *pbVar8 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar12 = uVar12 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar6 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        }
        lVar6 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_270);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar9 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_270);
          sprintf(in_line,"rewind of \"%s\"",pcVar7);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar7);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar12);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar7);
              iVar4 = uVar12 + 1;
              while ((((lVar10 = ftell((FILE *)ofp), -1 < lVar10 &&
                       (iVar5 = fseek((FILE *)ofp,lVar10,0), -1 < iVar5)) &&
                      (iVar5 = __isoc99_fscanf(ofp,"%5lx",alStack_170), iVar5 == 1)) &&
                     ((iVar5 = fseek((FILE *)ofp,lVar10,0), -1 < iVar5 &&
                      (iVar5 = fprintf((FILE *)ofp,"%05lx\n",alStack_170[0] + lVar6), -1 < iVar5))))
                    ) {
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b4f3;
      }
      goto LAB_0010b503;
    }
  }
  do_oracles_cold_3();
LAB_0010b503:
  pcVar7 = acStack_270;
  do_oracles_cold_2();
  lVar6 = (long)qt_hdr.n_hdr;
  if (0 < lVar6) {
    __s2 = qt_hdr.id;
    lVar10 = 0;
    do {
      iVar4 = strncmp(pcVar7,*__s2,3);
      if (iVar4 == 0) {
        return;
      }
      lVar10 = lVar10 + 1;
      __s2 = __s2 + 1;
    } while (lVar6 != lVar10);
  }
  return;
code_r0x0010b1fb:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b276;
  goto LAB_0010b1af;
LAB_0010b276:
  uVar12 = uVar12 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar6 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
  goto LAB_0010b1ac;
}

Assistant:

void do_rumors(const char *in_tru, const char *in_false, const char *outfile)
{
	long	true_rumor_size;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	fprintf(ofp, "%s", Dont_Edit_Data);

	if (!(ifp = fopen(in_tru, RDTMODE))) {
		perror(in_tru);
		fclose(ofp);
		unlink(outfile);	/* kill empty output file */
		exit(EXIT_FAILURE);
	}

	/* get size of true rumors file */
	fseek(ifp, 0L, SEEK_END);
	true_rumor_size = ftell(ifp);
	fprintf(ofp,"%06lx\n", true_rumor_size);
	fseek(ifp, 0L, SEEK_SET);

	/* copy true rumors */
	while (fgets(in_line, sizeof in_line, ifp) != 0)
		fputs(xcrypt(in_line), ofp);

	fclose(ifp);

	if (!(ifp = fopen(in_false, RDTMODE))) {
		perror(in_false);
		fclose(ofp);
		unlink(outfile);	/* kill incomplete output file */
		exit(EXIT_FAILURE);
	}

	/* copy false rumors */
	while (fgets(in_line, sizeof in_line, ifp) != 0)
		fputs(xcrypt(in_line), ofp);

	fclose(ifp);
	fclose(ofp);
	return;
}